

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_v_predictor_32x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  ushort uVar21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  unkuint9 Var26;
  undefined1 auVar27 [11];
  undefined1 auVar28 [15];
  unkuint9 Var29;
  undefined1 auVar30 [11];
  undefined1 auVar31 [15];
  unkuint9 Var32;
  undefined1 auVar33 [11];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  ulong uVar40;
  uint uVar41;
  bool bVar42;
  short sVar43;
  short sVar45;
  undefined1 auVar44 [16];
  ushort uVar46;
  short sVar47;
  ushort uVar48;
  short sVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  short sVar60;
  ushort uVar61;
  ushort uVar62;
  short sVar63;
  ushort uVar65;
  ushort uVar66;
  short sVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  undefined1 auVar64 [16];
  short sVar81;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  undefined1 auVar82 [16];
  short sVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  
  auVar44 = pshuflw(ZEXT116(left_column[0x3f]),ZEXT116(left_column[0x3f]),0);
  auVar1 = *(undefined1 (*) [16])top_row;
  auVar2 = *(undefined1 (*) [16])(top_row + 0x10);
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar1._0_13_;
  auVar3[0xe] = auVar1[7];
  auVar6[0xc] = auVar1[6];
  auVar6._0_12_ = auVar1._0_12_;
  auVar6._13_2_ = auVar3._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar1._0_11_;
  auVar9._12_3_ = auVar6._12_3_;
  auVar12[10] = auVar1[5];
  auVar12._0_10_ = auVar1._0_10_;
  auVar12._11_4_ = auVar9._11_4_;
  auVar15[9] = 0;
  auVar15._0_9_ = auVar1._0_9_;
  auVar15._10_5_ = auVar12._10_5_;
  auVar18[8] = auVar1[4];
  auVar18._0_8_ = auVar1._0_8_;
  auVar18._9_6_ = auVar15._9_6_;
  auVar25._7_8_ = 0;
  auVar25._0_7_ = auVar18._8_7_;
  Var26 = CONCAT81(SUB158(auVar25 << 0x40,7),auVar1[3]);
  auVar34._9_6_ = 0;
  auVar34._0_9_ = Var26;
  auVar27._1_10_ = SUB1510(auVar34 << 0x30,5);
  auVar27[0] = auVar1[2];
  auVar35._11_4_ = 0;
  auVar35._0_11_ = auVar27;
  auVar22[2] = auVar1[1];
  auVar22._0_2_ = auVar1._0_2_;
  auVar22._3_12_ = SUB1512(auVar35 << 0x20,3);
  uVar46 = auVar1._0_2_ & 0xff;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar2._0_13_;
  auVar4[0xe] = auVar2[7];
  auVar7[0xc] = auVar2[6];
  auVar7._0_12_ = auVar2._0_12_;
  auVar7._13_2_ = auVar4._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar2._0_11_;
  auVar10._12_3_ = auVar7._12_3_;
  auVar13[10] = auVar2[5];
  auVar13._0_10_ = auVar2._0_10_;
  auVar13._11_4_ = auVar10._11_4_;
  auVar16[9] = 0;
  auVar16._0_9_ = auVar2._0_9_;
  auVar16._10_5_ = auVar13._10_5_;
  auVar19[8] = auVar2[4];
  auVar19._0_8_ = auVar2._0_8_;
  auVar19._9_6_ = auVar16._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar19._8_7_;
  Var29 = CONCAT81(SUB158(auVar28 << 0x40,7),auVar2[3]);
  auVar36._9_6_ = 0;
  auVar36._0_9_ = Var29;
  auVar30._1_10_ = SUB1510(auVar36 << 0x30,5);
  auVar30[0] = auVar2[2];
  auVar37._11_4_ = 0;
  auVar37._0_11_ = auVar30;
  auVar23[2] = auVar2[1];
  auVar23._0_2_ = auVar2._0_2_;
  auVar23._3_12_ = SUB1512(auVar37 << 0x20,3);
  uVar48 = auVar2._0_2_ & 0xff;
  uVar40 = 0;
  do {
    auVar52 = *(undefined1 (*) [16])(smooth_weights + uVar40 + 0x3c);
    auVar5[0xd] = 0;
    auVar5._0_13_ = auVar52._0_13_;
    auVar5[0xe] = auVar52[7];
    auVar8[0xc] = auVar52[6];
    auVar8._0_12_ = auVar52._0_12_;
    auVar8._13_2_ = auVar5._13_2_;
    auVar11[0xb] = 0;
    auVar11._0_11_ = auVar52._0_11_;
    auVar11._12_3_ = auVar8._12_3_;
    auVar14[10] = auVar52[5];
    auVar14._0_10_ = auVar52._0_10_;
    auVar14._11_4_ = auVar11._11_4_;
    auVar17[9] = 0;
    auVar17._0_9_ = auVar52._0_9_;
    auVar17._10_5_ = auVar14._10_5_;
    auVar20[8] = auVar52[4];
    auVar20._0_8_ = auVar52._0_8_;
    auVar20._9_6_ = auVar17._9_6_;
    auVar31._7_8_ = 0;
    auVar31._0_7_ = auVar20._8_7_;
    Var32 = CONCAT81(SUB158(auVar31 << 0x40,7),auVar52[3]);
    auVar38._9_6_ = 0;
    auVar38._0_9_ = Var32;
    auVar33._1_10_ = SUB1510(auVar38 << 0x30,5);
    auVar33[0] = auVar52[2];
    auVar39._11_4_ = 0;
    auVar39._0_11_ = auVar33;
    auVar24[2] = auVar52[1];
    auVar24._0_2_ = auVar52._0_2_;
    auVar24._3_12_ = SUB1512(auVar39 << 0x20,3);
    auVar64._0_2_ = auVar52._0_2_ & 0xff;
    auVar64._2_13_ = auVar24._2_13_;
    auVar64[0xf] = 0;
    auVar50._0_2_ = CONCAT11(0,auVar52[8]);
    auVar50[2] = auVar52[9];
    auVar50[3] = 0;
    auVar50[4] = auVar52[10];
    auVar50[5] = 0;
    auVar50[6] = auVar52[0xb];
    auVar50[7] = 0;
    auVar50[8] = auVar52[0xc];
    auVar50[9] = 0;
    auVar50[10] = auVar52[0xd];
    auVar50[0xb] = 0;
    auVar50[0xc] = auVar52[0xe];
    auVar50[0xd] = 0;
    auVar50[0xe] = auVar52[0xf];
    auVar50[0xf] = 0;
    sVar43 = auVar44._0_2_;
    auVar51._0_2_ = (0x100 - auVar64._0_2_) * sVar43;
    sVar45 = auVar44._2_2_;
    auVar51._2_2_ = (0x100 - auVar24._2_2_) * sVar45;
    auVar51._4_2_ = (0x100 - auVar33._0_2_) * sVar43;
    auVar51._6_2_ = (0x100 - (short)Var32) * sVar45;
    auVar51._8_2_ = (0x100 - auVar20._8_2_) * sVar43;
    auVar51._10_2_ = (0x100 - auVar14._10_2_) * sVar45;
    auVar51._12_2_ = (0x100 - auVar8._12_2_) * sVar43;
    auVar51._14_2_ = (0x100 - (auVar5._13_2_ >> 8)) * sVar45;
    uVar41 = 0xfefdfefe;
    do {
      uVar41 = uVar41 + 0x2020202;
      auVar82._4_4_ = uVar41;
      auVar82._0_4_ = uVar41;
      auVar82._8_4_ = uVar41;
      auVar82._12_4_ = uVar41;
      auVar53 = pshufb(auVar64,auVar82);
      auVar82 = pshufb(auVar51,auVar82);
      sVar55 = auVar53._0_2_;
      sVar56 = auVar53._2_2_;
      sVar57 = auVar53._4_2_;
      sVar47 = (short)Var26;
      sVar58 = auVar53._6_2_;
      sVar59 = auVar53._8_2_;
      sVar60 = auVar53._10_2_;
      sVar63 = auVar53._12_2_;
      sVar67 = auVar53._14_2_;
      uVar21 = auVar3._13_2_ >> 8;
      sVar81 = auVar82._0_2_ + 0x80;
      sVar83 = auVar82._2_2_ + 0x80;
      sVar84 = auVar82._4_2_ + 0x80;
      sVar85 = auVar82._6_2_ + 0x80;
      sVar86 = auVar82._8_2_ + 0x80;
      sVar87 = auVar82._10_2_ + 0x80;
      sVar88 = auVar82._12_2_ + 0x80;
      sVar89 = auVar82._14_2_ + 0x80;
      uVar61 = sVar55 * uVar46 + sVar81;
      uVar65 = sVar56 * auVar22._2_2_ + sVar83;
      uVar68 = sVar57 * auVar27._0_2_ + sVar84;
      uVar70 = sVar58 * sVar47 + sVar85;
      uVar72 = sVar59 * auVar18._8_2_ + sVar86;
      uVar74 = sVar60 * auVar12._10_2_ + sVar87;
      uVar76 = sVar63 * auVar6._12_2_ + sVar88;
      uVar78 = sVar67 * uVar21 + sVar89;
      uVar62 = uVar61 >> 8;
      uVar66 = uVar65 >> 8;
      uVar69 = uVar68 >> 8;
      uVar71 = uVar70 >> 8;
      uVar73 = uVar72 >> 8;
      uVar75 = uVar74 >> 8;
      uVar77 = uVar76 >> 8;
      uVar79 = uVar78 >> 8;
      uVar90 = sVar55 * (ushort)auVar1[8] + sVar81;
      uVar92 = sVar56 * (ushort)auVar1[9] + sVar83;
      uVar94 = sVar57 * (ushort)auVar1[10] + sVar84;
      uVar96 = sVar58 * (ushort)auVar1[0xb] + sVar85;
      uVar98 = sVar59 * (ushort)auVar1[0xc] + sVar86;
      uVar100 = sVar60 * (ushort)auVar1[0xd] + sVar87;
      uVar102 = sVar63 * (ushort)auVar1[0xe] + sVar88;
      uVar104 = sVar67 * (ushort)auVar1[0xf] + sVar89;
      uVar91 = uVar90 >> 8;
      uVar93 = uVar92 >> 8;
      uVar95 = uVar94 >> 8;
      uVar97 = uVar96 >> 8;
      uVar99 = uVar98 >> 8;
      uVar101 = uVar100 >> 8;
      uVar103 = uVar102 >> 8;
      uVar105 = uVar104 >> 8;
      *dst = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
      dst[1] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
      dst[2] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69);
      dst[3] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
      dst[4] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
      dst[5] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
      dst[6] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
      dst[7] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
      dst[8] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
      dst[9] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
      dst[10] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
      dst[0xb] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
      dst[0xc] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar99);
      dst[0xd] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar101);
      dst[0xe] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
      dst[0xf] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
      sVar49 = (short)Var29;
      uVar61 = auVar4._13_2_ >> 8;
      uVar91 = sVar55 * uVar48 + sVar81;
      uVar93 = sVar56 * auVar23._2_2_ + sVar83;
      uVar95 = sVar57 * auVar30._0_2_ + sVar84;
      uVar97 = sVar58 * sVar49 + sVar85;
      uVar99 = sVar59 * auVar19._8_2_ + sVar86;
      uVar101 = sVar60 * auVar13._10_2_ + sVar87;
      uVar103 = sVar63 * auVar7._12_2_ + sVar88;
      uVar105 = sVar67 * uVar61 + sVar89;
      uVar92 = uVar91 >> 8;
      uVar94 = uVar93 >> 8;
      uVar96 = uVar95 >> 8;
      uVar98 = uVar97 >> 8;
      uVar100 = uVar99 >> 8;
      uVar102 = uVar101 >> 8;
      uVar104 = uVar103 >> 8;
      uVar80 = uVar105 >> 8;
      uVar62 = sVar55 * (ushort)auVar2[8] + sVar81;
      uVar66 = sVar56 * (ushort)auVar2[9] + sVar83;
      uVar69 = sVar57 * (ushort)auVar2[10] + sVar84;
      uVar71 = sVar58 * (ushort)auVar2[0xb] + sVar85;
      uVar73 = sVar59 * (ushort)auVar2[0xc] + sVar86;
      uVar75 = sVar60 * (ushort)auVar2[0xd] + sVar87;
      uVar77 = sVar63 * (ushort)auVar2[0xe] + sVar88;
      uVar79 = sVar67 * (ushort)auVar2[0xf] + sVar89;
      uVar65 = uVar62 >> 8;
      uVar68 = uVar66 >> 8;
      uVar70 = uVar69 >> 8;
      uVar72 = uVar71 >> 8;
      uVar74 = uVar73 >> 8;
      uVar76 = uVar75 >> 8;
      uVar78 = uVar77 >> 8;
      uVar90 = uVar79 >> 8;
      dst[0x10] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
      dst[0x11] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
      dst[0x12] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
      dst[0x13] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
      dst[0x14] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
      dst[0x15] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
      dst[0x16] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
      dst[0x17] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar80);
      dst[0x18] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar65);
      dst[0x19] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar68);
      dst[0x1a] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
      dst[0x1b] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
      dst[0x1c] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
      dst[0x1d] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
      dst[0x1e] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
      dst[0x1f] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar90);
      dst = dst + stride;
    } while (uVar41 < 0xd0c0d0d);
    auVar53._0_2_ = (0x100 - auVar50._0_2_) * sVar43;
    auVar53._2_2_ = (0x100 - (ushort)auVar52[9]) * sVar45;
    auVar53._4_2_ = (0x100 - (ushort)auVar52[10]) * sVar43;
    auVar53._6_2_ = (0x100 - (ushort)auVar52[0xb]) * sVar45;
    auVar53._8_2_ = (0x100 - (ushort)auVar52[0xc]) * sVar43;
    auVar53._10_2_ = (0x100 - (ushort)auVar52[0xd]) * sVar45;
    auVar53._12_2_ = (0x100 - (ushort)auVar52[0xe]) * sVar43;
    auVar53._14_2_ = (0x100 - (ushort)auVar52[0xf]) * sVar45;
    uVar41 = 0xfefdfefe;
    do {
      uVar41 = uVar41 + 0x2020202;
      auVar54._4_4_ = uVar41;
      auVar54._0_4_ = uVar41;
      auVar54._8_4_ = uVar41;
      auVar54._12_4_ = uVar41;
      auVar52 = pshufb(auVar50,auVar54);
      auVar64 = pshufb(auVar53,auVar54);
      sVar43 = auVar52._0_2_;
      sVar45 = auVar52._2_2_;
      sVar55 = auVar52._4_2_;
      sVar56 = auVar52._6_2_;
      sVar57 = auVar52._8_2_;
      sVar58 = auVar52._10_2_;
      sVar59 = auVar52._12_2_;
      sVar60 = auVar52._14_2_;
      sVar63 = auVar64._0_2_ + 0x80;
      sVar67 = auVar64._2_2_ + 0x80;
      sVar81 = auVar64._4_2_ + 0x80;
      sVar83 = auVar64._6_2_ + 0x80;
      sVar84 = auVar64._8_2_ + 0x80;
      sVar85 = auVar64._10_2_ + 0x80;
      sVar86 = auVar64._12_2_ + 0x80;
      sVar87 = auVar64._14_2_ + 0x80;
      uVar62 = sVar43 * uVar46 + sVar63;
      uVar66 = sVar45 * auVar22._2_2_ + sVar67;
      uVar69 = sVar55 * auVar27._0_2_ + sVar81;
      uVar71 = sVar56 * sVar47 + sVar83;
      uVar73 = sVar57 * auVar18._8_2_ + sVar84;
      uVar75 = sVar58 * auVar12._10_2_ + sVar85;
      uVar77 = sVar59 * auVar6._12_2_ + sVar86;
      uVar79 = sVar60 * uVar21 + sVar87;
      uVar65 = uVar62 >> 8;
      uVar68 = uVar66 >> 8;
      uVar70 = uVar69 >> 8;
      uVar72 = uVar71 >> 8;
      uVar74 = uVar73 >> 8;
      uVar76 = uVar75 >> 8;
      uVar78 = uVar77 >> 8;
      uVar90 = uVar79 >> 8;
      uVar91 = sVar43 * (ushort)auVar1[8] + sVar63;
      uVar93 = sVar45 * (ushort)auVar1[9] + sVar67;
      uVar95 = sVar55 * (ushort)auVar1[10] + sVar81;
      uVar97 = sVar56 * (ushort)auVar1[0xb] + sVar83;
      uVar99 = sVar57 * (ushort)auVar1[0xc] + sVar84;
      uVar101 = sVar58 * (ushort)auVar1[0xd] + sVar85;
      uVar103 = sVar59 * (ushort)auVar1[0xe] + sVar86;
      uVar105 = sVar60 * (ushort)auVar1[0xf] + sVar87;
      uVar92 = uVar91 >> 8;
      uVar94 = uVar93 >> 8;
      uVar96 = uVar95 >> 8;
      uVar98 = uVar97 >> 8;
      uVar100 = uVar99 >> 8;
      uVar102 = uVar101 >> 8;
      uVar104 = uVar103 >> 8;
      uVar80 = uVar105 >> 8;
      *dst = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar65);
      dst[1] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar68);
      dst[2] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
      dst[3] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
      dst[4] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
      dst[5] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
      dst[6] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
      dst[7] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar90);
      dst[8] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
      dst[9] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
      dst[10] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
      dst[0xb] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
      dst[0xc] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
      dst[0xd] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
      dst[0xe] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
      dst[0xf] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar80);
      uVar91 = sVar43 * uVar48 + sVar63;
      uVar93 = sVar45 * auVar23._2_2_ + sVar67;
      uVar95 = sVar55 * auVar30._0_2_ + sVar81;
      uVar97 = sVar56 * sVar49 + sVar83;
      uVar99 = sVar57 * auVar19._8_2_ + sVar84;
      uVar101 = sVar58 * auVar13._10_2_ + sVar85;
      uVar103 = sVar59 * auVar7._12_2_ + sVar86;
      uVar105 = sVar60 * uVar61 + sVar87;
      uVar92 = uVar91 >> 8;
      uVar94 = uVar93 >> 8;
      uVar96 = uVar95 >> 8;
      uVar98 = uVar97 >> 8;
      uVar100 = uVar99 >> 8;
      uVar102 = uVar101 >> 8;
      uVar104 = uVar103 >> 8;
      uVar80 = uVar105 >> 8;
      uVar62 = sVar43 * (ushort)auVar2[8] + sVar63;
      uVar66 = sVar45 * (ushort)auVar2[9] + sVar67;
      uVar69 = sVar55 * (ushort)auVar2[10] + sVar81;
      uVar71 = sVar56 * (ushort)auVar2[0xb] + sVar83;
      uVar73 = sVar57 * (ushort)auVar2[0xc] + sVar84;
      uVar75 = sVar58 * (ushort)auVar2[0xd] + sVar85;
      uVar77 = sVar59 * (ushort)auVar2[0xe] + sVar86;
      uVar79 = sVar60 * (ushort)auVar2[0xf] + sVar87;
      uVar65 = uVar62 >> 8;
      uVar68 = uVar66 >> 8;
      uVar70 = uVar69 >> 8;
      uVar72 = uVar71 >> 8;
      uVar74 = uVar73 >> 8;
      uVar76 = uVar75 >> 8;
      uVar78 = uVar77 >> 8;
      uVar90 = uVar79 >> 8;
      dst[0x10] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
      dst[0x11] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
      dst[0x12] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
      dst[0x13] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
      dst[0x14] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
      dst[0x15] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
      dst[0x16] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
      dst[0x17] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar80);
      dst[0x18] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar65);
      dst[0x19] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar68);
      dst[0x1a] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
      dst[0x1b] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
      dst[0x1c] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
      dst[0x1d] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
      dst[0x1e] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
      dst[0x1f] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar90);
      dst = dst + stride;
    } while (uVar41 < 0xd0c0d0d);
    bVar42 = uVar40 < 0x30;
    uVar40 = uVar40 + 0x10;
  } while (bVar42);
  return;
}

Assistant:

void aom_smooth_v_predictor_32x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[63]);
  const __m128i top_lo = LoadUnaligned16(top_row);
  const __m128i top_hi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lo, zero);
  const __m128i top3 = cvtepu8_epi16(top_hi);
  const __m128i top4 = _mm_unpackhi_epi8(top_hi, zero);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  const uint8_t *weights_base_ptr = smooth_weights + 60;
  for (int left_offset = 0; left_offset < 64; left_offset += 16) {
    const __m128i weights = LoadUnaligned16(weights_base_ptr + left_offset);
    const __m128i weights_lo = cvtepu8_epi16(weights);
    const __m128i weights_hi = _mm_unpackhi_epi8(weights, zero);
    const __m128i inverted_weights_lo = _mm_sub_epi16(scale, weights_lo);
    const __m128i inverted_weights_hi = _mm_sub_epi16(scale, weights_hi);
    const __m128i scaled_bottom_left_lo =
        _mm_mullo_epi16(inverted_weights_lo, bottom_left);
    const __m128i scaled_bottom_left_hi =
        _mm_mullo_epi16(inverted_weights_hi, bottom_left);

    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_lo, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_lo, y_select);
      write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_hi, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_hi, y_select);
      write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
  }
}